

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_gcd(__mpz_struct *g,__mpz_struct *u,__mpz_struct *v)

{
  int iVar1;
  __mpz_struct *p_Var2;
  __mpz_struct *a;
  mp_ptr pmVar3;
  mp_limb_t mVar4;
  long in_RDX;
  long in_RSI;
  __mpz_struct *in_RDI;
  mp_limb_t *gp;
  int c;
  mp_bitcnt_t gz;
  mp_bitcnt_t vz;
  mp_bitcnt_t uz;
  mpz_t tv;
  mpz_t tu;
  __mpz_struct *in_stack_ffffffffffffff88;
  __mpz_struct *in_stack_ffffffffffffff90;
  __mpz_struct *in_stack_ffffffffffffffa0;
  int local_34;
  mp_limb_t *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  __mpz_struct *in_stack_ffffffffffffffe0;
  
  if (*(int *)(in_RSI + 4) == 0) {
    mpz_abs(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else if (*(int *)(in_RDX + 4) == 0) {
    mpz_abs(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    mpz_init((__mpz_struct *)&stack0xffffffffffffffd8);
    mpz_init((__mpz_struct *)&stack0xffffffffffffffc8);
    mpz_abs(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    p_Var2 = (__mpz_struct *)mpz_make_odd(in_stack_ffffffffffffff90);
    mpz_abs(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    a = (__mpz_struct *)mpz_make_odd(in_stack_ffffffffffffff90);
    if (p_Var2 < a) {
      a = p_Var2;
    }
    if (in_stack_ffffffffffffffdc < local_34) {
      mpz_swap((__mpz_struct *)&stack0xffffffffffffffd8,(__mpz_struct *)&stack0xffffffffffffffc8);
    }
    mpz_tdiv_r(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(__mpz_struct *)0x9a994a);
    if (in_stack_ffffffffffffffdc == 0) {
      mpz_swap(in_RDI,(__mpz_struct *)&stack0xffffffffffffffc8);
    }
    else {
      while( true ) {
        mpz_make_odd(in_stack_ffffffffffffff90);
        iVar1 = mpz_cmp(a,in_stack_ffffffffffffff90);
        if (iVar1 == 0) break;
        if (iVar1 < 0) {
          mpz_swap((__mpz_struct *)&stack0xffffffffffffffd8,(__mpz_struct *)&stack0xffffffffffffffc8
                  );
        }
        if (local_34 == 1) {
          mpz_tdiv_r(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(__mpz_struct *)0x9a99d4);
          if (in_RDI->_mp_alloc < 1) {
            pmVar3 = mpz_realloc(in_stack_ffffffffffffffa0,(mp_size_t)a);
          }
          else {
            pmVar3 = in_RDI->_mp_d;
          }
          mVar4._0_4_ = in_stack_ffffffffffffffe0->_mp_alloc;
          mVar4._4_4_ = in_stack_ffffffffffffffe0->_mp_size;
          mVar4 = mpn_gcd_11(mVar4,*in_stack_ffffffffffffffd0);
          *pmVar3 = mVar4;
          in_RDI->_mp_size = (uint)(*pmVar3 != 0);
          goto LAB_009a9a66;
        }
        mpz_sub(in_stack_ffffffffffffffa0,a,in_stack_ffffffffffffff90);
      }
      mpz_swap(in_RDI,(__mpz_struct *)&stack0xffffffffffffffd8);
    }
LAB_009a9a66:
    mpz_clear((__mpz_struct *)0x9a9a70);
    mpz_clear((__mpz_struct *)0x9a9a7a);
    mpz_mul_2exp(in_stack_ffffffffffffffe0,
                 (__mpz_struct *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 (mp_bitcnt_t)in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void
mpz_gcd (mpz_t g, const mpz_t u, const mpz_t v)
{
  mpz_t tu, tv;
  mp_bitcnt_t uz, vz, gz;

  if (u->_mp_size == 0)
    {
      mpz_abs (g, v);
      return;
    }
  if (v->_mp_size == 0)
    {
      mpz_abs (g, u);
      return;
    }

  mpz_init (tu);
  mpz_init (tv);

  mpz_abs (tu, u);
  uz = mpz_make_odd (tu);
  mpz_abs (tv, v);
  vz = mpz_make_odd (tv);
  gz = GMP_MIN (uz, vz);

  if (tu->_mp_size < tv->_mp_size)
    mpz_swap (tu, tv);

  mpz_tdiv_r (tu, tu, tv);
  if (tu->_mp_size == 0)
    {
      mpz_swap (g, tv);
    }
  else
    for (;;)
      {
	int c;

	mpz_make_odd (tu);
	c = mpz_cmp (tu, tv);
	if (c == 0)
	  {
	    mpz_swap (g, tu);
	    break;
	  }
	if (c < 0)
	  mpz_swap (tu, tv);

	if (tv->_mp_size == 1)
	  {
	    mp_limb_t *gp;

	    mpz_tdiv_r (tu, tu, tv);
	    gp = MPZ_REALLOC (g, 1); /* gp = mpz_limbs_modify (g, 1); */
	    *gp = mpn_gcd_11 (tu->_mp_d[0], tv->_mp_d[0]);

	    g->_mp_size = *gp != 0; /* mpz_limbs_finish (g, 1); */
	    break;
	  }
	mpz_sub (tu, tu, tv);
      }
  mpz_clear (tu);
  mpz_clear (tv);
  mpz_mul_2exp (g, g, gz);
}